

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall
LoopCrosser::CellCrossesAnySubcell(LoopCrosser *this,S2ClippedShape *a_clipped,S2CellId b_id)

{
  double dVar1;
  double dVar2;
  int i;
  pointer ppSVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  ulong uVar9;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar10;
  S2Point *pSVar11;
  S2Point *pSVar12;
  const_reference b_clipped;
  ulong uVar13;
  pointer ppSVar14;
  bool bVar15;
  vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_> *__range2;
  S2PaddedCell b_root;
  S2PaddedCell local_90;
  
  S2PaddedCell::S2PaddedCell(&local_90,b_id,0.0);
  if (1 < *(uint *)&a_clipped->field_0x4) {
    uVar9 = (ulong)(*(uint *)&a_clipped->field_0x4 >> 1);
    bVar15 = true;
    uVar13 = 0;
    do {
      paVar10 = &a_clipped->field_3;
      if (5 < *(uint *)&a_clipped->field_0x4) {
        paVar10 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(a_clipped->field_3).edges_;
      }
      i = *(int *)((long)paVar10 + uVar13 * 4);
      pSVar11 = S2Loop::vertex(this->a_,i);
      pSVar12 = S2Loop::vertex(this->a_,i + 1);
      S2CrossingEdgeQuery::GetCells(&this->b_query_,pSVar11,pSVar12,&local_90,&this->b_cells_);
      if ((this->b_cells_).
          super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->b_cells_).
          super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pSVar11 = S2Loop::vertex(this->a_,i);
        pSVar12 = S2Loop::vertex(this->a_,i + 1);
        (this->crosser_).a_ = pSVar11;
        (this->crosser_).b_ = pSVar12;
        dVar1 = pSVar12->c_[0];
        dVar2 = pSVar11->c_[0];
        dVar4 = pSVar11->c_[1];
        dVar5 = pSVar11->c_[2];
        dVar6 = pSVar12->c_[1];
        dVar7 = pSVar12->c_[2];
        (this->crosser_).a_cross_b_.c_[0] = dVar7 * dVar4 - dVar5 * dVar6;
        (this->crosser_).a_cross_b_.c_[1] = dVar1 * dVar5 - dVar2 * dVar7;
        (this->crosser_).a_cross_b_.c_[2] = dVar6 * dVar2 - dVar4 * dVar1;
        (this->crosser_).have_tangents_ = false;
        (this->crosser_).c_ = (S2Point *)0x0;
        this->aj_ = i;
        this->bj_prev_ = -2;
        ppSVar3 = (this->b_cells_).
                  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppSVar14 = (this->b_cells_).
                        super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppSVar14 != ppSVar3;
            ppSVar14 = ppSVar14 + 1) {
          b_clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                      operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                  *)*ppSVar14,0);
          bVar8 = EdgeCrossesCell(this,b_clipped);
          if (bVar8) {
            return bVar15;
          }
        }
      }
      uVar13 = uVar13 + 1;
      bVar15 = uVar13 < uVar9;
    } while (uVar13 != uVar9);
  }
  return false;
}

Assistant:

bool LoopCrosser::CellCrossesAnySubcell(const S2ClippedShape& a_clipped,
                                        S2CellId b_id) {
  // Test all edges of "a_clipped" against all edges of B.  The relevant B
  // edges are guaranteed to be children of "b_id", which lets us find the
  // correct index cells more efficiently.
  S2PaddedCell b_root(b_id, 0);
  int a_num_edges = a_clipped.num_edges();
  for (int i = 0; i < a_num_edges; ++i) {
    int aj = a_clipped.edge(i);
    // Use an S2CrossingEdgeQuery starting at "b_root" to find the index cells
    // of B that might contain crossing edges.
    b_query_.GetCells(a_.vertex(aj), a_.vertex(aj+1), b_root, &b_cells_);
    if (b_cells_.empty()) continue;
    StartEdge(aj);
    for (const S2ShapeIndexCell* b_cell : b_cells_) {
      if (EdgeCrossesCell(b_cell->clipped(0))) return true;
    }
  }
  return false;
}